

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cpp
# Opt level: O0

bool __thiscall sf::Texture::create(Texture *this,uint width,uint height)

{
  uint X;
  uint Y;
  int iVar1;
  ostream *poVar2;
  Uint64 UVar3;
  uint in_EDX;
  undefined8 uVar4;
  uint in_ESI;
  uint *in_RDI;
  char *unaff_retaddr;
  uint in_stack_0000000c;
  char *in_stack_00000010;
  TextureSaver save;
  GLuint texture;
  uint maxSize;
  Vector2u actualSize;
  TransientContextLock lock;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  TransientContextLock *in_stack_fffffffffffffed0;
  undefined4 local_120;
  undefined4 local_11c;
  bool local_c1;
  uint local_40 [3];
  Vector2<unsigned_int> local_34 [3];
  uint local_18;
  uint local_14;
  byte local_1;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  if ((in_ESI == 0) || (in_EDX == 0)) {
    poVar2 = err();
    poVar2 = std::operator<<(poVar2,"Failed to create texture, invalid size (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_14);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_18);
    poVar2 = std::operator<<(poVar2,")");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    local_1 = 0;
  }
  else {
    GlResource::TransientContextLock::TransientContextLock(in_stack_fffffffffffffed0);
    priv::ensureExtensionsInit();
    X = getValidSize(local_14);
    Y = getValidSize(local_18);
    Vector2<unsigned_int>::Vector2(local_34,X,Y);
    local_40[2] = getMaximumSize();
    if ((local_40[2] < local_34[0].x) || (local_40[2] < local_34[0].y)) {
      poVar2 = err();
      poVar2 = std::operator<<(poVar2,"Failed to create texture, its internal size is too high ");
      poVar2 = std::operator<<(poVar2,"(");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34[0].x);
      poVar2 = std::operator<<(poVar2,"x");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34[0].y);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = std::operator<<(poVar2,"maximum is ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40[2]);
      poVar2 = std::operator<<(poVar2,"x");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_40[2]);
      poVar2 = std::operator<<(poVar2,")");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_1 = 0;
      local_40[1] = 1;
    }
    else {
      *in_RDI = local_14;
      in_RDI[1] = local_18;
      *(ulong *)(in_RDI + 2) = CONCAT44(local_34[0].y,local_34[0].x);
      *(undefined1 *)((long)in_RDI + 0x17) = 0;
      *(undefined1 *)(in_RDI + 6) = 0;
      if (in_RDI[4] == 0) {
        glGenTextures(1,local_40);
        priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
        in_RDI[4] = local_40[0];
      }
      priv::TextureSaver::TextureSaver
                ((TextureSaver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
      if ((create(unsigned_int,unsigned_int)::textureEdgeClamp == '\0') &&
         (iVar1 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureEdgeClamp),
         iVar1 != 0)) {
        local_c1 = sfogl_ext_SGIS_texture_edge_clamp != 0 || sfogl_ext_EXT_texture_edge_clamp != 0;
        create::textureEdgeClamp = local_c1;
        __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureEdgeClamp);
      }
      if ((((*(byte *)((long)in_RDI + 0x16) & 1) == 0) && ((create::textureEdgeClamp & 1U) == 0)) &&
         ((create::warned & 1U) == 0)) {
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"OpenGL extension SGIS_texture_edge_clamp unavailable");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Artifacts may occur along texture edges");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        poVar2 = err();
        poVar2 = std::operator<<(poVar2,"Ensure that hardware acceleration is enabled if available")
        ;
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        create::warned = true;
      }
      if ((create(unsigned_int,unsigned_int)::textureSrgb == '\0') &&
         (iVar1 = __cxa_guard_acquire(&create(unsigned_int,unsigned_int)::textureSrgb), iVar1 != 0))
      {
        create::textureSrgb = sfogl_ext_EXT_texture_sRGB != 0;
        __cxa_guard_release(&create(unsigned_int,unsigned_int)::textureSrgb);
      }
      if (((*(byte *)((long)in_RDI + 0x15) & 1) != 0) && ((create::textureSrgb & 1U) == 0)) {
        if ((create(unsigned_int,unsigned_int)::warned & 1U) == 0) {
          poVar2 = err();
          poVar2 = std::operator<<(poVar2,"OpenGL extension EXT_texture_sRGB unavailable");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = err();
          poVar2 = std::operator<<(poVar2,"Automatic sRGB to linear conversion disabled");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          create(unsigned_int,unsigned_int)::warned = true;
        }
        *(undefined1 *)((long)in_RDI + 0x15) = 0;
      }
      glBindTexture(0xde1,in_RDI[4]);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      uVar4 = 0x1908;
      if ((*(byte *)((long)in_RDI + 0x15) & 1) != 0) {
        uVar4 = 0x8c43;
      }
      in_stack_fffffffffffffec0 = 0x1401;
      glTexImage2D(0xde1,0,uVar4,in_RDI[2],in_RDI[3],0,0x1908,0x1401,0);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      if ((*(byte *)((long)in_RDI + 0x16) & 1) == 0) {
        local_11c = 0x2900;
        if ((create::textureEdgeClamp & 1U) != 0) {
          local_11c = 0x812f;
        }
      }
      else {
        local_11c = 0x2901;
      }
      glTexParameteri(0xde1,0x2802,local_11c);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      if ((*(byte *)((long)in_RDI + 0x16) & 1) == 0) {
        local_120 = 0x2900;
        if ((create::textureEdgeClamp & 1U) != 0) {
          local_120 = 0x812f;
        }
      }
      else {
        local_120 = 0x2901;
      }
      glTexParameteri(0xde1,0x2803,local_120);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      glTexParameteri(0xde1,0x2800,(byte)in_RDI[5] & 1 | 0x2600);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      glTexParameteri(0xde1,0x2801,(byte)in_RDI[5] & 1 | 0x2600);
      priv::glCheckError(in_stack_00000010,in_stack_0000000c,unaff_retaddr);
      UVar3 = anon_unknown.dwarf_86926::getUniqueId();
      *(Uint64 *)(in_RDI + 8) = UVar3;
      *(undefined1 *)((long)in_RDI + 0x19) = 0;
      local_1 = 1;
      local_40[1] = 1;
      priv::TextureSaver::~TextureSaver
                ((TextureSaver *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
    }
    GlResource::TransientContextLock::~TransientContextLock
              ((TransientContextLock *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0)
              );
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool Texture::create(unsigned int width, unsigned int height)
{
    // Check if texture parameters are valid before creating it
    if ((width == 0) || (height == 0))
    {
        err() << "Failed to create texture, invalid size (" << width << "x" << height << ")" << std::endl;
        return false;
    }

    TransientContextLock lock;

    // Make sure that extensions are initialized
    priv::ensureExtensionsInit();

    // Compute the internal texture dimensions depending on NPOT textures support
    Vector2u actualSize(getValidSize(width), getValidSize(height));

    // Check the maximum texture size
    unsigned int maxSize = getMaximumSize();
    if ((actualSize.x > maxSize) || (actualSize.y > maxSize))
    {
        err() << "Failed to create texture, its internal size is too high "
              << "(" << actualSize.x << "x" << actualSize.y << ", "
              << "maximum is " << maxSize << "x" << maxSize << ")"
              << std::endl;
        return false;
    }

    // All the validity checks passed, we can store the new texture settings
    m_size.x        = width;
    m_size.y        = height;
    m_actualSize    = actualSize;
    m_pixelsFlipped = false;
    m_fboAttachment = false;

    // Create the OpenGL texture if it doesn't exist yet
    if (!m_texture)
    {
        GLuint texture;
        glCheck(glGenTextures(1, &texture));
        m_texture = static_cast<unsigned int>(texture);
    }

    // Make sure that the current texture binding will be preserved
    priv::TextureSaver save;

    static bool textureEdgeClamp = GLEXT_texture_edge_clamp || GLEXT_EXT_texture_edge_clamp;

    if (!m_isRepeated && !textureEdgeClamp)
    {
        static bool warned = false;

        if (!warned)
        {
            err() << "OpenGL extension SGIS_texture_edge_clamp unavailable" << std::endl;
            err() << "Artifacts may occur along texture edges" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    static bool textureSrgb = GLEXT_texture_sRGB;

    if (m_sRgb && !textureSrgb)
    {
        static bool warned = false;

        if (!warned)
        {
#ifndef SFML_OPENGL_ES
            err() << "OpenGL extension EXT_texture_sRGB unavailable" << std::endl;
#else
            err() << "OpenGL ES extension EXT_sRGB unavailable" << std::endl;
#endif
            err() << "Automatic sRGB to linear conversion disabled" << std::endl;

            warned = true;
        }

        m_sRgb = false;
    }

    // Initialize the texture
    glCheck(glBindTexture(GL_TEXTURE_2D, m_texture));
    glCheck(glTexImage2D(GL_TEXTURE_2D, 0, (m_sRgb ? GLEXT_GL_SRGB8_ALPHA8 : GL_RGBA), m_actualSize.x, m_actualSize.y, 0, GL_RGBA, GL_UNSIGNED_BYTE, NULL));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, m_isRepeated ? GL_REPEAT : (textureEdgeClamp ? GLEXT_GL_CLAMP_TO_EDGE : GLEXT_GL_CLAMP)));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    glCheck(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, m_isSmooth ? GL_LINEAR : GL_NEAREST));
    m_cacheId = getUniqueId();

    m_hasMipmap = false;

    return true;
}